

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.hpp
# Opt level: O0

string * __thiscall
KokkosTools::demangleNameKokkos_abi_cxx11_
          (string *__return_storage_ptr__,KokkosTools *this,string_view mangled_name)

{
  string *psVar1;
  size_type __pos;
  size_type __n;
  char *pcVar2;
  string_view mangled_name_00;
  string_view mangled_name_01;
  string_view mangled_name_02;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string local_c0;
  allocator<char> local_89;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  string local_78 [32];
  undefined1 local_58 [16];
  string local_48;
  size_type local_28;
  size_t pos;
  string_view mangled_name_local;
  
  pcVar2 = mangled_name._M_str;
  mangled_name_local._M_len = mangled_name._M_len;
  pos = (size_t)this;
  mangled_name_local._M_str = (char *)__return_storage_ptr__;
  local_28 = std::basic_string_view<char,_std::char_traits<char>_>::find
                       ((basic_string_view<char,_std::char_traits<char>_> *)&pos,'/',0);
  if ((local_28 == 0xffffffffffffffff) || (local_28 == 0)) {
    mangled_name_02._M_str = pcVar2;
    mangled_name_02._M_len = mangled_name_local._M_len;
    demangleName_abi_cxx11_(__return_storage_ptr__,(KokkosTools *)pos,mangled_name_02);
  }
  else {
    local_88 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&pos,0,local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_78,&local_88,&local_89);
    local_58 = std::__cxx11::string::operator_cast_to_basic_string_view(local_78);
    mangled_name_00._M_len = local_58._8_8_;
    mangled_name_00._M_str = pcVar2;
    demangleName_abi_cxx11_(&local_48,local_58._0_8_,mangled_name_00);
    psVar1 = (string *)std::__cxx11::string::append((char *)&local_48);
    __pos = local_28 + 1;
    __n = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&pos);
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&pos,__pos,__n);
    mangled_name_01._M_len = bVar3._M_str;
    mangled_name_01._M_str = (char *)bVar3._M_len;
    demangleName_abi_cxx11_(&local_c0,(KokkosTools *)bVar3._M_len,mangled_name_01);
    psVar1 = (string *)std::__cxx11::string::append(psVar1);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_89);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string demangleNameKokkos(const std::string_view mangled_name) {
  if (size_t pos = mangled_name.find('/', 0);
      pos != std::string_view::npos && pos > 0) {
    /// An explicit copy of the first part of the string is needed, because
    /// @c abi::__cxa_demangle will parse the pointer until its NULL-terminated.
    return demangleName(std::string(mangled_name.substr(0, pos)))
        .append("/")
        .append(
            demangleName(mangled_name.substr(pos + 1, mangled_name.size())));
  } else {
    return demangleName(mangled_name);
  }
}